

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::FunctionalTest::verifyOutputImage
          (FunctionalTest *this,testCase *test_case,size_t output_format_index,
          GLint output_channel_size,size_t index_of_swizzled_channel,GLubyte *data)

{
  GLubyte *value;
  TestError *this_00;
  wrongResults *this_01;
  bool local_71;
  bool res;
  GLvoid *pointer;
  size_t offset;
  size_t i;
  size_t texel_size;
  GLubyte expected_data_top [8];
  GLubyte expected_data_low [8];
  _texture_format *output_format;
  GLubyte *data_local;
  size_t index_of_swizzled_channel_local;
  GLint output_channel_size_local;
  size_t output_format_index_local;
  testCase *test_case_local;
  FunctionalTest *this_local;
  
  memset(expected_data_top,0,8);
  memset(&texel_size,0,8);
  i = 0;
  calculate_expected_value
            (test_case->m_source_texture_format_index,output_format_index,index_of_swizzled_channel,
             test_case->m_texture_sizes[index_of_swizzled_channel],output_channel_size,
             expected_data_top,&texel_size,&i);
  offset = 0;
  while( true ) {
    if (0x3f < offset) {
      return;
    }
    value = data + offset * i;
    switch(*(undefined4 *)(texture_formats + output_format_index * 0x78 + 0xc)) {
    case 0x1400:
      local_71 = isInRange<signed_char>(value,expected_data_top,&texel_size);
      break;
    case 0x1401:
      local_71 = isInRange<unsigned_char>(value,expected_data_top,&texel_size);
      break;
    case 0x1402:
      local_71 = isInRange<short>(value,expected_data_top,&texel_size);
      break;
    case 0x1403:
      local_71 = isInRange<unsigned_short>(value,expected_data_top,&texel_size);
      break;
    case 0x1404:
      local_71 = isInRange<int>(value,expected_data_top,&texel_size);
      break;
    case 0x1405:
      local_71 = isInRange<unsigned_short>(value,expected_data_top,&texel_size);
      break;
    case 0x1406:
      local_71 = isInRange<float>(value,expected_data_top,&texel_size);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0x107f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    case 0x140b:
      local_71 = isInRange<signed_char>(value,expected_data_top,&texel_size);
    }
    if (local_71 == false) break;
    offset = offset + 1;
  }
  this_01 = (wrongResults *)__cxa_allocate_exception(0x48);
  wrongResults::wrongResults(this_01,test_case);
  __cxa_throw(this_01,&wrongResults::typeinfo,wrongResults::~wrongResults);
}

Assistant:

void FunctionalTest::verifyOutputImage(const testCase& test_case, size_t output_format_index,
									   glw::GLint output_channel_size, size_t index_of_swizzled_channel,
									   const glw::GLubyte* data)
{
	const _texture_format& output_format = texture_formats[output_format_index];

	glw::GLubyte expected_data_low[8] = { 0 };
	glw::GLubyte expected_data_top[8] = { 0 };
	size_t		 texel_size			  = 0;

	calculate_expected_value(test_case.m_source_texture_format_index, output_format_index, index_of_swizzled_channel,
							 test_case.m_texture_sizes[index_of_swizzled_channel], output_channel_size,
							 expected_data_low, expected_data_top, texel_size);

	for (size_t i = 0; i < m_output_height * m_output_width; ++i)
	{
		const size_t	   offset  = i * texel_size;
		const glw::GLvoid* pointer = data + offset;

		bool res = false;

		switch (output_format.m_type)
		{
		case GL_BYTE:
			res = isInRange<glw::GLbyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_BYTE:
			res = isInRange<glw::GLubyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_SHORT:
			res = isInRange<glw::GLshort>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_SHORT:
			res = isInRange<glw::GLushort>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_HALF_FLOAT:
			res = isInRange<glw::GLbyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_INT:
			res = isInRange<glw::GLint>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_INT:
			res = isInRange<glw::GLhalf>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_FLOAT:
			res = isInRange<glw::GLfloat>(pointer, expected_data_low, expected_data_top);
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		if (false == res)
		{
			throw wrongResults(test_case);
		}
	}
}